

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

Real __thiscall PeleLM::adjust_p_and_divu_for_closed_chamber(PeleLM *this,MultiFab *mac_divu)

{
  pointer pSVar1;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  Real RVar5;
  Real RVar6;
  char cVar7;
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  PeleLM *this_01;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> this_02;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Long LVar15;
  Long LVar16;
  int n;
  TimeCenter TVar17;
  int iVar18;
  long lVar19;
  double *pdVar20;
  int iVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  long lVar25;
  double *pdVar26;
  long lVar27;
  double *pdVar28;
  bool bVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  Real tT;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  Real y [21];
  Real cpor [21];
  MFIter mfi;
  Real tresult [21];
  MultiFab theta_halft;
  double local_b28;
  double dStack_b20;
  double local_ae8;
  double dStack_ae0;
  undefined1 local_ac8 [32];
  double local_aa8;
  double dStack_aa0;
  double local_a98;
  double dStack_a90;
  double local_a88;
  double dStack_a80;
  double local_a78;
  double dStack_a70;
  double local_a68;
  double local_a60;
  double dStack_a58;
  double local_a50;
  double dStack_a48;
  double local_a40;
  double dStack_a38;
  double local_a30;
  double dStack_a28;
  double local_a18;
  undefined8 uStack_a10;
  double local_a08;
  double dStack_a00;
  double local_9f8;
  double dStack_9f0;
  double local_9e8;
  undefined8 uStack_9e0;
  PeleLM *local_9d8;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_9d0;
  long local_9c8;
  long local_9c0;
  double *local_9b8;
  long local_9b0;
  long local_9a8;
  double *local_9a0;
  long local_998;
  long local_990;
  double *local_988;
  long local_980;
  long local_978;
  double *local_970;
  long local_968;
  long local_960;
  double *local_958;
  long local_950;
  long local_948;
  long local_940;
  long local_938;
  long local_930;
  long local_928;
  long local_920;
  long local_918;
  long local_910;
  long local_908;
  double *local_900;
  double *local_8f8;
  double *local_8f0;
  double *local_8e8;
  double *local_8e0;
  long local_8d8;
  long local_8d0;
  long local_8c8;
  double *local_8c0;
  double *local_8b8;
  double *local_8b0;
  double *local_8a8;
  double *local_8a0;
  Box local_894;
  double local_878;
  double dStack_870;
  double local_868;
  double dStack_860;
  double local_858;
  undefined8 uStack_850;
  double local_848;
  double dStack_840;
  double local_838;
  undefined8 uStack_830;
  double local_828;
  double dStack_820;
  double local_818;
  double dStack_810;
  double local_808;
  undefined8 uStack_800;
  double local_7f8;
  double dStack_7f0;
  double local_7e8;
  undefined8 uStack_7e0;
  Array4<const_double> local_7d8;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined1 local_728 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_718;
  double dStack_700;
  double local_6f8;
  Vector<int,_std::allocator<int>_> *pVStack_6f0;
  Vector<int,_std::allocator<int>_> *local_6e8;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *pVStack_6e0;
  Vector<int,_std::allocator<int>_> *local_6d8;
  Vector<int,_std::allocator<int>_> *pVStack_6d0;
  double local_6c8;
  double dStack_6c0;
  double local_6b8;
  double dStack_6b0;
  double local_6a8;
  double dStack_6a0;
  double local_698;
  double local_690;
  double local_688;
  Real local_598;
  Real RStack_590;
  double local_588;
  undefined8 uStack_580;
  double local_578;
  undefined8 uStack_570;
  double local_568;
  undefined8 uStack_560;
  double local_558;
  undefined8 uStack_550;
  double local_548;
  double local_538;
  double local_528;
  double dStack_520;
  double local_518;
  double dStack_510;
  double local_508;
  double dStack_500;
  double local_4f8;
  double dStack_4f0;
  double local_4e8;
  double dStack_4e0;
  double local_4d8;
  double dStack_4d0;
  double local_4c8;
  double dStack_4c0;
  double local_4b8;
  double dStack_4b0;
  double local_4a8;
  double dStack_4a0;
  double local_498;
  double dStack_490;
  double local_488;
  double dStack_480;
  double local_478;
  undefined8 uStack_470;
  double local_468;
  double dStack_460;
  double local_458;
  double dStack_450;
  double local_448;
  double dStack_440;
  double local_438;
  double dStack_430;
  double local_428;
  double dStack_420;
  double local_418;
  double dStack_410;
  double local_408;
  undefined8 uStack_400;
  Array4<const_double> local_3f8;
  Array4<const_double> local_3b8;
  Array4<double> local_378;
  Array4<const_double> local_338;
  Array4<const_double> local_2f8;
  MFIter local_2b8;
  Array4<double> local_258 [2];
  FabArray<amrex::FArrayBox> local_1b0;
  
  pSVar1 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_9d0._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar1->new_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
  this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar1->old_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  TVar17 = amrex::StateDescriptor::timeType(pSVar1->desc);
  if (TVar17 == Point) {
    dVar2 = (pSVar1->old_time).stop;
  }
  else {
    dVar2 = ((pSVar1->old_time).start + (pSVar1->old_time).stop) * 0.5;
  }
  pSVar1 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  TVar17 = amrex::StateDescriptor::timeType(pSVar1->desc);
  if (TVar17 == Point) {
    dVar3 = (pSVar1->new_time).stop;
  }
  else {
    dVar3 = ((pSVar1->new_time).start + (pSVar1->new_time).stop) * 0.5;
  }
  local_728._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_728._8_8_ = (FabArrayBase *)0x0;
  local_718.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_718.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_718.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258[0].p = (double *)&PTR__FabFactory_008378d0;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_1b0,&(this->super_NavierStokesBase).super_AmrLevel.grids,
             &(this->super_NavierStokesBase).super_AmrLevel.dmap,1,nGrowAdvForcing,
             (MFInfo *)local_728,(FabFactory<amrex::FArrayBox> *)local_258);
  local_9d8 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_718);
  amrex::MFIter::MFIter
            (&local_2b8,
             (FabArrayBase *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
  if (local_2b8.currentIndex < local_2b8.endIndex) {
    do {
      amrex::MFIter::tilebox(&local_894,&local_2b8);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_3b8,
                 (FabArray<amrex::FArrayBox> *)
                 this_00.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_2b8,first_spec)
      ;
      this_02._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
           (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)local_9d0;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_3f8,
                 (FabArray<amrex::FArrayBox> *)
                 local_9d0._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_2b8,first_spec)
      ;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_2f8,
                 (FabArray<amrex::FArrayBox> *)
                 this_00.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_2b8,
                 NavierStokesBase::Temp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_338,
                 (FabArray<amrex::FArrayBox> *)
                 this_02._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_2b8,
                 NavierStokesBase::Temp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_378,&local_1b0,&local_2b8);
      LVar16 = local_3b8.nstride;
      LVar15 = local_3f8.nstride;
      iVar14 = local_894.bigend.vect[2];
      iVar13 = local_894.bigend.vect[1];
      iVar12 = local_894.bigend.vect[0];
      iVar11 = local_894.smallend.vect[1];
      iVar21 = local_894.smallend.vect[0];
      if (local_894.smallend.vect[2] <= local_894.bigend.vect[2]) {
        local_598 = p_amb_old;
        RStack_590 = p_amb_new;
        local_988 = local_2f8.p;
        local_958 = local_3b8.p + -(long)local_3b8.begin.x;
        local_928 = local_2f8.jstride;
        local_970 = local_3f8.p + -(long)local_3f8.begin.x;
        local_990 = local_2f8.kstride;
        local_960 = local_3b8.kstride << 3;
        local_968 = -(long)local_3b8.begin.z;
        local_908 = local_3b8.jstride << 3;
        local_910 = -(long)local_3b8.begin.y;
        local_978 = local_3f8.kstride << 3;
        local_980 = -(long)local_3f8.begin.z;
        local_918 = local_3f8.jstride << 3;
        local_920 = -(long)local_3f8.begin.y;
        local_8c8 = (long)local_2f8.begin.x;
        local_930 = (long)local_2f8.begin.y;
        local_998 = (long)local_2f8.begin.z;
        local_9a0 = local_338.p;
        local_938 = local_338.jstride;
        local_9a8 = local_338.kstride;
        local_8d0 = (long)local_338.begin.x;
        local_940 = (long)local_338.begin.y;
        local_9b0 = (long)local_338.begin.z;
        local_9b8 = local_378.p;
        local_948 = local_378.jstride;
        local_9c0 = local_378.kstride;
        local_8d8 = (long)local_378.begin.x;
        local_950 = (long)local_378.begin.y;
        local_9c8 = (long)local_378.begin.z;
        iVar9 = local_894.smallend.vect[2];
        do {
          if (iVar11 <= iVar13) {
            lVar19 = (long)iVar9;
            local_8e0 = (double *)((local_980 + lVar19) * local_978 + (long)local_970);
            local_8e8 = (double *)((local_968 + lVar19) * local_960 + (long)local_958);
            local_8f0 = local_988 + (lVar19 - local_998) * local_990;
            local_8f8 = local_9a0 + (lVar19 - local_9b0) * local_9a8;
            local_900 = local_9b8 + (lVar19 - local_9c8) * local_9c0;
            iVar10 = iVar11;
            do {
              if (iVar21 <= iVar12) {
                lVar19 = (long)iVar10;
                local_8a0 = (double *)((local_920 + lVar19) * local_918 + (long)local_8e0);
                local_8a8 = (double *)((local_910 + lVar19) * local_908 + (long)local_8e8);
                local_8b0 = local_8f0 + (lVar19 - local_930) * local_928;
                local_8b8 = local_8f8 + (lVar19 - local_940) * local_938;
                local_8c0 = local_900 + (lVar19 - local_950) * local_948;
                iVar18 = iVar21;
                do {
                  pdVar23 = local_8a0 + iVar18;
                  pdVar28 = local_8a0 + iVar18;
                  pdVar26 = local_8a8 + iVar18;
                  pdVar20 = local_8a8 + iVar18;
                  dVar33 = 0.0;
                  lVar19 = 0x15;
                  do {
                    dVar33 = dVar33 + *pdVar20;
                    pdVar20 = pdVar20 + LVar16;
                    lVar19 = lVar19 + -1;
                  } while (lVar19 != 0);
                  memset(local_ac8,0,0xa8);
                  lVar19 = 0;
                  do {
                    *(double *)(local_ac8 + lVar19 * 8) = *pdVar26 * (1.0 / dVar33);
                    lVar19 = lVar19 + 1;
                    pdVar26 = pdVar26 + LVar16;
                  } while (lVar19 != 0x15);
                  dVar33 = local_8b0[iVar18 - local_8c8];
                  dVar30 = dVar33 * dVar33;
                  dVar4 = dVar33 * dVar30;
                  dVar49 = dVar33 * dVar4;
                  local_7d8.p = (double *)0x3fdfbefbefbefbf0;
                  local_7d8.jstride = 0x3fefbefbefbefbf0;
                  local_7d8.kstride = 0x3fb000418a43bf8c;
                  local_7d8.nstride = 0x3fa000418a43bf8c;
                  local_7d8.begin.x = -0x48f1ed02;
                  local_7d8.begin.y = 0x3fae1af1;
                  local_7d8.begin.z = -0xa963427;
                  local_7d8.end.x = 0x3fac6bb6;
                  local_7d8.end.y = 0x42c3dbd3;
                  local_7d8.end.z = 0x3f9f0650;
                  local_7d8.ncomp = -0x2085bd62;
                  local_7d8._60_4_ = 0x3fb24021;
                  local_798 = 0x3fb24021df7a429e;
                  uStack_790 = 0x3fb106e55a53f15b;
                  local_788 = 0x3fafea0b02aa32d7;
                  uStack_780 = 0x3fa24778bbe8f7dd;
                  local_778 = 0x3f9744998b9a1c0d;
                  uStack_770 = 0x3fa1a4eba7fd99b3;
                  local_768 = 0x3fa10d488e47ecc4;
                  uStack_760 = 0x3fa07f7f2eefd932;
                  local_758 = 0x3fa24021df7a429e;
                  uStack_750 = 0x3fa19e14f6ff5920;
                  local_748 = 0x3fa106e55a53f15b;
                  uStack_740 = 0x3fa246cdaf410bdd;
                  local_738 = 0x3f99a1cd6070c7ee;
                  if (1000.0 <= dVar33) {
                    local_728._0_8_ =
                         (FabArrayBase *)
                         (dVar49 * 2.00255376e-14 +
                         dVar4 * -1.79566394e-10 +
                         dVar30 * 4.99456778e-07 + dVar33 * -4.94024731e-05 + 3.3372792);
                    local_728._8_8_ =
                         (FabArrayBase *)
                         (dVar49 * 4.98197357e-22 +
                         dVar4 * -4.73515235e-18 +
                         dVar30 * 1.61561948e-14 + dVar33 * -2.30842973e-11 + 2.50000001);
                    local_718.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(dVar49 * 1.22833691e-15 +
                                  dVar4 * -1.00177799e-11 +
                                  dVar30 * 4.19484589e-08 + dVar33 * -8.59741137e-05 + 2.56942078);
                    local_718.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(dVar49 * -2.16717794e-14 +
                                  dVar4 * 2.09470555e-10 +
                                  dVar30 * -7.57966669e-07 + dVar33 * 0.00148308754 + 3.28253784);
                    local_718.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(dVar49 * 1.17412376e-14 +
                                  dVar4 * -8.79461556e-11 +
                                  dVar30 * 1.26505228e-07 + dVar33 * 0.000548429716 + 3.09288767);
                    dStack_700 = dVar49 * 1.68200992e-14 +
                                 dVar4 * -9.7041987e-11 +
                                 dVar30 * -1.64072518e-07 + dVar33 * 0.00217691804 + 3.03399249;
                    local_6f8 = dVar49 * -1.07908535e-14 +
                                dVar4 * 1.1424637e-10 +
                                dVar30 * -6.3365815e-07 + dVar33 * 0.00223982013 + 4.0172109;
                    pVStack_6f0 = (Vector<int,_std::allocator<int>_> *)
                                  (dVar49 * -1.87727567e-14 +
                                  dVar4 * 2.60179549e-10 +
                                  dVar30 * -1.40894597e-06 + dVar33 * 0.00365639292 + 2.87410113);
                    local_6e8 = (Vector<int,_std::allocator<int>_> *)
                                (dVar49 * -3.39716365e-14 +
                                dVar4 * 4.17906e-10 +
                                dVar30 * -2.01191947e-06 + dVar33 * 0.00465588637 + 2.29203842);
                    pVStack_6e0 = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                  (dVar49 * -4.67154394e-14 +
                                  dVar4 * 5.95684644e-10 +
                                  dVar30 * -2.98714348e-06 + dVar33 * 0.00723990037 + 2.28571772);
                    local_6d8 = (Vector<int,_std::allocator<int>_> *)
                                (dVar49 * -1.0181523e-13 +
                                dVar4 * 1.22292535e-09 +
                                dVar30 * -5.73285809e-06 + dVar33 * 0.0133909467 + 0.074851495);
                    pVStack_6d0 = (Vector<int,_std::allocator<int>_> *)
                                  (dVar49 * -2.03647716e-14 +
                                  dVar4 * 2.30053008e-10 +
                                  dVar30 * -9.98825771e-07 + dVar33 * 0.00206252743 + 2.71518561);
                    local_6c8 = dVar49 * -4.72084164e-14 +
                                dVar4 * 5.23490188e-10 +
                                dVar30 * -2.21481404e-06 + dVar33 * 0.00441437026 + 3.85746029;
                    dStack_6c0 = dVar49 * -5.33508711e-14 +
                                 dVar4 * 5.89161778e-10 +
                                 dVar30 * -2.48445613e-06 + dVar33 * 0.00495695526 + 2.77217438;
                    local_6b8 = dVar49 * -8.8385564e-14 +
                                dVar4 * 1.00641212e-09 +
                                dVar30 * -4.42258813e-06 + dVar33 * 0.00920000082 + 1.76069008;
                    dStack_6b0 = dVar49 * -2.112616e-14 +
                                 dVar4 * 3.944431e-10 +
                                 dVar30 * -2.656384e-06 + dVar33 * 0.007871497 + 3.770799;
                    local_6a8 = dVar49 * -1.25706061e-13 +
                                dVar4 * 1.47222923e-09 +
                                dVar30 * -6.71077915e-06 + dVar33 * 0.0146454151 + 2.03611116;
                    dStack_6a0 = dVar49 * -1.49641576e-13 +
                                 dVar4 * 1.75217689e-09 +
                                 dVar30 * -7.98206668e-06 + dVar33 * 0.0173972722 + 1.95465642;
                    local_698 = dVar49 * -1.9000289e-13 +
                                dVar4 * 2.21412001e-09 +
                                dVar30 * -1.00256067e-05 + dVar33 * 0.0216852677 + 1.0718815;
                    dVar36 = dVar4 * 1.0097038e-10 +
                             dVar30 * -5.68476e-07 + dVar33 * 0.0014879768 + 2.92664;
                    dVar31 = dVar49 * -6.753351e-15;
                  }
                  else {
                    local_728._0_8_ =
                         dVar49 * -7.37611761e-12 +
                         dVar4 * 2.01572094e-08 +
                         dVar30 * -1.9478151e-05 + dVar33 * 0.00798052075 + 2.34433112;
                    local_728._8_8_ =
                         (FabArrayBase *)
                         (dVar49 * -9.27732332e-22 +
                         dVar4 * 2.30081632e-18 +
                         dVar30 * -1.99591964e-15 + dVar33 * 7.05332819e-13 + 2.5);
                    local_718.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(dVar49 * 2.11265971e-12 +
                                  dVar4 * -6.12806624e-09 +
                                  dVar30 * 6.64306396e-06 + dVar33 * -0.00327931884 + 3.1682671);
                    local_718.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(dVar49 * 3.24372837e-12 +
                                  dVar4 * -9.68129509e-09 +
                                  dVar30 * 9.84730201e-06 + dVar33 * -0.00299673416 + 3.78245636);
                    local_718.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(dVar49 * 1.3641147e-12 +
                                  dVar4 * -3.88113333e-09 +
                                  dVar30 * 4.61793841e-06 + dVar33 * -0.00240131752 + 3.99201543);
                    dStack_700 = dVar49 * 1.77197817e-12 +
                                 dVar4 * -5.48797062e-09 +
                                 dVar30 * 6.52040211e-06 + dVar33 * -0.0020364341 + 4.19864056;
                    local_6f8 = dVar49 * 9.29225124e-12 +
                                dVar4 * -2.42763894e-08 +
                                dVar30 * 2.11582891e-05 + dVar33 * -0.00474912051 + 4.30179801;
                    pVStack_6f0 = (Vector<int,_std::allocator<int>_> *)
                                  (dVar49 * 1.68741719e-12 +
                                  dVar4 * -3.85091153e-09 +
                                  dVar30 * 2.79489841e-06 + dVar33 * 0.000968872143 + 3.76267867);
                    local_6e8 = (Vector<int,_std::allocator<int>_> *)
                                (dVar49 * 1.94314737e-12 +
                                dVar4 * -6.68815981e-09 +
                                dVar30 * 8.2329622e-06 + dVar33 * -0.00236661419 + 4.19860411);
                    pVStack_6e0 = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                  (dVar49 * 2.54385734e-12 +
                                  dVar4 * -6.87117425e-09 +
                                  dVar30 * 5.73021856e-06 + dVar33 * 0.00201095175 + 3.6735904);
                    local_6d8 = (Vector<int,_std::allocator<int>_> *)
                                (dVar49 * 1.66693956e-11 +
                                dVar4 * -4.84743026e-08 +
                                dVar30 * 4.91800599e-05 + dVar33 * -0.0136709788 + 5.14987613);
                    pVStack_6d0 = (Vector<int,_std::allocator<int>_> *)
                                  (dVar49 * -9.04424499e-13 +
                                  dVar4 * 9.07005884e-10 +
                                  dVar30 * 1.01681433e-06 + dVar33 * -0.00061035368 + 3.57953347);
                    local_6c8 = dVar49 * -1.43699548e-13 +
                                dVar4 * 2.45919022e-09 +
                                dVar30 * -7.12356269e-06 + dVar33 * 0.00898459677 + 2.35677352;
                    dStack_6c0 = dVar49 * 4.33768865e-12 +
                                 dVar4 * -1.33144093e-08 +
                                 dVar30 * 1.37799446e-05 + dVar33 * -0.00324392532 + 4.22118584;
                    local_6b8 = dVar49 * 1.31772652e-11 +
                                dVar4 * -3.79285261e-08 +
                                dVar30 * 3.73220008e-05 + dVar33 * -0.00990833369 + 4.79372315;
                    dStack_6b0 = dVar49 * 2.07561e-12 +
                                 dVar4 * -7.377636e-09 +
                                 dVar30 * 5.338472e-06 + dVar33 * 0.007216595 + 2.106204;
                    local_6a8 = dVar49 * 2.69884373e-11 +
                                dVar4 * -6.91588753e-08 +
                                dVar30 * 5.70990292e-05 + dVar33 * -0.00757052247 + 3.95920148;
                    dStack_6a0 = dVar49 * 2.30509004e-11 +
                                 dVar4 * -5.99126606e-08 +
                                 dVar30 * 4.97142807e-05 + dVar33 * -0.00418658892 + 4.30646568;
                    local_698 = dVar49 * 2.68685771e-11 +
                                dVar4 * -7.08466285e-08 +
                                dVar30 * 5.99438288e-05 + dVar33 * -0.0055015427 + 4.29142492;
                    dVar36 = dVar4 * 5.641515e-09 +
                             dVar30 * -3.963222e-06 + dVar33 * 0.0014082404 + 3.298677;
                    dVar31 = dVar49 * -2.444854e-12;
                  }
                  local_690 = dVar31 + dVar36;
                  local_688 = dVar49 * 0.0 + dVar4 * 0.0 + dVar30 * 0.0 + dVar33 * 0.0 + 2.5;
                  lVar19 = 0;
                  do {
                    (&local_258[0].p)[lVar19] =
                         (double *)
                         (*(double *)(local_728 + lVar19 * 8) * *(double *)(local_ac8 + lVar19 * 8)
                         * (double)(&local_7d8.p)[lVar19]);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 0x15);
                  local_9e8 = 0.0;
                  lVar19 = 0;
                  do {
                    local_9e8 = local_9e8 + (double)(&local_258[0].p)[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 0x15);
                  uStack_9e0 = 0;
                  if (1000.0 <= dVar33) {
                    local_ae8 = dVar49 * -8.8385564e-14 +
                                dVar4 * 1.00641212e-09 +
                                dVar30 * -4.42258813e-06 + dVar33 * 0.00920000082 + 0.76069008;
                    dStack_ae0 = dVar49 * -2.112616e-14 +
                                 dVar4 * 3.944431e-10 +
                                 dVar30 * -2.656384e-06 + dVar33 * 0.007871497 + 2.770799;
                    local_9f8 = dVar49 * -4.72084164e-14 +
                                dVar4 * 5.23490188e-10 +
                                dVar30 * -2.21481404e-06 + dVar33 * 0.00441437026 + 2.85746029;
                    dStack_9f0 = dVar49 * -5.33508711e-14 +
                                 dVar4 * 5.89161778e-10 +
                                 dVar30 * -2.48445613e-06 + dVar33 * 0.00495695526 + 1.77217438;
                    local_a08 = dVar49 * -1.0181523e-13 +
                                dVar4 * 1.22292535e-09 +
                                dVar30 * -5.73285809e-06 + dVar33 * 0.0133909467 + -0.925148505;
                    dStack_a00 = dVar49 * -2.03647716e-14 +
                                 dVar4 * 2.30053008e-10 +
                                 dVar30 * -9.98825771e-07 + dVar33 * 0.00206252743 + 1.71518561;
                    local_b28 = dVar49 * -3.39716365e-14 +
                                dVar4 * 4.17906e-10 +
                                dVar30 * -2.01191947e-06 + dVar33 * 0.00465588637 + 1.29203842;
                    dStack_b20 = dVar49 * -4.67154394e-14 +
                                 dVar4 * 5.95684644e-10 +
                                 dVar30 * -2.98714348e-06 + dVar33 * 0.00723990037 + 1.28571772;
                    local_7f8 = dVar49 * -1.07908535e-14 +
                                dVar4 * 1.1424637e-10 +
                                dVar30 * -6.3365815e-07 + dVar33 * 0.00223982013 + 3.0172109;
                    dStack_7f0 = dVar49 * -1.87727567e-14 +
                                 dVar4 * 2.60179549e-10 +
                                 dVar30 * -1.40894597e-06 + dVar33 * 0.00365639292 + 1.87410113;
                    local_828 = dVar49 * 1.17412376e-14 +
                                dVar4 * -8.79461556e-11 +
                                dVar30 * 1.26505228e-07 + dVar33 * 0.000548429716 + 2.09288767;
                    dStack_820 = dVar49 * 1.68200992e-14 +
                                 dVar4 * -9.7041987e-11 +
                                 dVar30 * -1.64072518e-07 + dVar33 * 0.00217691804 + 2.03399249;
                    local_848 = dVar49 * 1.22833691e-15 +
                                dVar4 * -1.00177799e-11 +
                                dVar30 * 4.19484589e-08 + dVar33 * -8.59741137e-05 + 1.56942078;
                    dStack_840 = dVar49 * -2.16717794e-14 +
                                 dVar4 * 2.09470555e-10 +
                                 dVar30 * -7.57966669e-07 + dVar33 * 0.00148308754 + 2.28253784;
                    local_818 = dVar49 * 2.00255376e-14 +
                                dVar4 * -1.79566394e-10 +
                                dVar30 * 4.99456778e-07 + dVar33 * -4.94024731e-05 + 2.3372792;
                    dStack_810 = dVar49 * 4.98197357e-22 +
                                 dVar4 * -4.73515235e-18 +
                                 dVar30 * 1.61561948e-14 + dVar33 * -2.30842973e-11 + 1.50000001;
                    local_7e8 = dVar49 * -1.25706061e-13 +
                                dVar4 * 1.47222923e-09 +
                                dVar30 * -6.71077915e-06 + dVar33 * 0.0146454151 + 1.03611116;
                    local_808 = dVar49 * -1.49641576e-13 +
                                dVar4 * 1.75217689e-09 +
                                dVar30 * -7.98206668e-06 + dVar33 * 0.0173972722 + 0.95465642;
                    local_838 = dVar49 * -1.9000289e-13 +
                                dVar4 * 2.21412001e-09 +
                                dVar30 * -1.00256067e-05 + dVar33 * 0.0216852677 + 0.0718815;
                    dVar31 = dVar4 * 1.0097038e-10 +
                             dVar30 * -5.68476e-07 + dVar33 * 0.0014879768 + 1.92664;
                    local_858 = dVar49 * -6.753351e-15;
                  }
                  else {
                    local_ae8 = dVar49 * 1.31772652e-11 +
                                dVar4 * -3.79285261e-08 +
                                dVar30 * 3.73220008e-05 + dVar33 * -0.00990833369 + 3.79372315;
                    dStack_ae0 = dVar49 * 2.07561e-12 +
                                 dVar4 * -7.377636e-09 +
                                 dVar30 * 5.338472e-06 + dVar33 * 0.007216595 + 1.106204;
                    local_9f8 = dVar49 * -1.43699548e-13 +
                                dVar4 * 2.45919022e-09 +
                                dVar30 * -7.12356269e-06 + dVar33 * 0.00898459677 + 1.35677352;
                    dStack_9f0 = dVar49 * 4.33768865e-12 +
                                 dVar4 * -1.33144093e-08 +
                                 dVar30 * 1.37799446e-05 + dVar33 * -0.00324392532 + 3.22118584;
                    local_a08 = dVar49 * 1.66693956e-11 +
                                dVar4 * -4.84743026e-08 +
                                dVar30 * 4.91800599e-05 + dVar33 * -0.0136709788 + 4.14987613;
                    dStack_a00 = dVar49 * -9.04424499e-13 +
                                 dVar4 * 9.07005884e-10 +
                                 dVar30 * 1.01681433e-06 + dVar33 * -0.00061035368 + 2.57953347;
                    local_b28 = dVar49 * 1.94314737e-12 +
                                dVar4 * -6.68815981e-09 +
                                dVar30 * 8.2329622e-06 + dVar33 * -0.00236661419 + 3.19860411;
                    dStack_b20 = dVar49 * 2.54385734e-12 +
                                 dVar4 * -6.87117425e-09 +
                                 dVar30 * 5.73021856e-06 + dVar33 * 0.00201095175 + 2.6735904;
                    local_7f8 = dVar49 * 9.29225124e-12 +
                                dVar4 * -2.42763894e-08 +
                                dVar30 * 2.11582891e-05 + dVar33 * -0.00474912051 + 3.30179801;
                    dStack_7f0 = dVar49 * 1.68741719e-12 +
                                 dVar4 * -3.85091153e-09 +
                                 dVar30 * 2.79489841e-06 + dVar33 * 0.000968872143 + 2.76267867;
                    local_828 = dVar49 * 1.3641147e-12 +
                                dVar4 * -3.88113333e-09 +
                                dVar30 * 4.61793841e-06 + dVar33 * -0.00240131752 + 2.99201543;
                    dStack_820 = dVar49 * 1.77197817e-12 +
                                 dVar4 * -5.48797062e-09 +
                                 dVar30 * 6.52040211e-06 + dVar33 * -0.0020364341 + 3.19864056;
                    local_848 = dVar49 * 2.11265971e-12 +
                                dVar4 * -6.12806624e-09 +
                                dVar30 * 6.64306396e-06 + dVar33 * -0.00327931884 + 2.1682671;
                    dStack_840 = dVar49 * 3.24372837e-12 +
                                 dVar4 * -9.68129509e-09 +
                                 dVar30 * 9.84730201e-06 + dVar33 * -0.00299673416 + 2.78245636;
                    local_818 = dVar49 * -7.37611761e-12 +
                                dVar4 * 2.01572094e-08 +
                                dVar30 * -1.9478151e-05 + dVar33 * 0.00798052075 + 1.34433112;
                    dStack_810 = dVar49 * -9.27732332e-22 +
                                 dVar4 * 2.30081632e-18 +
                                 dVar30 * -1.99591964e-15 + dVar33 * 7.05332819e-13 + 1.5;
                    local_7e8 = dVar49 * 2.69884373e-11 +
                                dVar4 * -6.91588753e-08 +
                                dVar30 * 5.70990292e-05 + dVar33 * -0.00757052247 + 2.95920148;
                    local_808 = dVar49 * 2.30509004e-11 +
                                dVar4 * -5.99126606e-08 +
                                dVar30 * 4.97142807e-05 + dVar33 * -0.00418658892 + 3.30646568;
                    local_838 = dVar49 * 2.68685771e-11 +
                                dVar4 * -7.08466285e-08 +
                                dVar30 * 5.99438288e-05 + dVar33 * -0.0055015427 + 3.29142492;
                    dVar31 = dVar4 * 5.641515e-09 +
                             dVar30 * -3.963222e-06 + dVar33 * 0.0014082404 + 2.298677;
                    local_858 = dVar49 * -2.444854e-12;
                  }
                  uStack_7e0 = 0;
                  uStack_800 = 0;
                  uStack_830 = 0;
                  local_858 = local_858 + dVar31;
                  uStack_850 = 0;
                  local_a18 = 0.0;
                  local_548 = (double)CONCAT44(local_ac8._4_4_,local_ac8._0_4_);
                  local_538 = (double)CONCAT44(local_ac8._12_4_,local_ac8._8_4_);
                  local_528 = (double)CONCAT44(local_ac8._20_4_,local_ac8._16_4_);
                  dStack_520 = (double)local_ac8._24_8_;
                  local_518 = (double)local_ac8._24_8_;
                  dStack_510 = local_aa8;
                  local_508 = local_aa8;
                  dStack_500 = dStack_aa0;
                  local_4f8 = dStack_aa0;
                  dStack_4f0 = local_a98;
                  local_4e8 = local_a98;
                  dStack_4e0 = dStack_a90;
                  local_4d8 = dStack_a90;
                  dStack_4d0 = local_a88;
                  local_4c8 = local_a88;
                  dStack_4c0 = dStack_a80;
                  local_4b8 = dStack_a80;
                  dStack_4b0 = local_a78;
                  local_4a8 = local_a78;
                  dStack_4a0 = dStack_a70;
                  local_498 = dStack_a70;
                  dStack_490 = local_a68;
                  local_478 = local_a68;
                  uStack_470 = 0;
                  local_488 = local_a60;
                  dStack_480 = dStack_a58;
                  local_468 = dStack_a58;
                  dStack_460 = local_a50;
                  lVar19 = 0x15;
                  local_458 = local_a50;
                  dStack_450 = dStack_a48;
                  local_448 = dStack_a48;
                  dStack_440 = local_a40;
                  local_438 = local_a40;
                  dStack_430 = dStack_a38;
                  local_428 = dStack_a38;
                  dStack_420 = local_a30;
                  local_418 = local_a30;
                  dStack_410 = dStack_a28;
                  local_408 = dStack_a28;
                  uStack_400 = 0;
                  do {
                    local_a18 = local_a18 + *pdVar28;
                    pdVar28 = pdVar28 + LVar15;
                    lVar19 = lVar19 + -1;
                  } while (lVar19 != 0);
                  local_a18 = 1.0 / local_a18;
                  memset(local_ac8,0,0xa8);
                  lVar19 = 0;
                  do {
                    *(double *)(local_ac8 + lVar19 * 8) = *pdVar23 * local_a18;
                    lVar19 = lVar19 + 1;
                    pdVar23 = pdVar23 + LVar15;
                  } while (lVar19 != 0x15);
                  dVar31 = local_8b8[iVar18 - local_8d0];
                  dVar32 = dVar31 * dVar31;
                  dVar36 = dVar31 * dVar32;
                  local_a18 = dVar31 * dVar36;
                  local_7d8.p = (double *)0x3fdfbefbefbefbf0;
                  local_7d8.jstride = 0x3fefbefbefbefbf0;
                  local_7d8.kstride = 0x3fb000418a43bf8c;
                  local_7d8.nstride = 0x3fa000418a43bf8c;
                  local_7d8.begin.x = -0x48f1ed02;
                  local_7d8.begin.y = 0x3fae1af1;
                  local_7d8.begin.z = -0xa963427;
                  local_7d8.end.x = 0x3fac6bb6;
                  local_7d8.end.y = 0x42c3dbd3;
                  local_7d8.end.z = 0x3f9f0650;
                  local_7d8.ncomp = -0x2085bd62;
                  local_7d8._60_4_ = 0x3fb24021;
                  local_798 = 0x3fb24021df7a429e;
                  uStack_790 = 0x3fb106e55a53f15b;
                  local_788 = 0x3fafea0b02aa32d7;
                  uStack_780 = 0x3fa24778bbe8f7dd;
                  local_778 = 0x3f9744998b9a1c0d;
                  uStack_770 = 0x3fa1a4eba7fd99b3;
                  local_768 = 0x3fa10d488e47ecc4;
                  uStack_760 = 0x3fa07f7f2eefd932;
                  local_758 = 0x3fa24021df7a429e;
                  uStack_750 = 0x3fa19e14f6ff5920;
                  local_748 = 0x3fa106e55a53f15b;
                  uStack_740 = 0x3fa246cdaf410bdd;
                  local_738 = 0x3f99a1cd6070c7ee;
                  if (1000.0 <= dVar31) {
                    local_728._0_8_ =
                         local_a18 * 2.00255376e-14 +
                         dVar36 * -1.79566394e-10 +
                         dVar32 * 4.99456778e-07 + dVar31 * -4.94024731e-05 + 3.3372792;
                    local_728._8_8_ =
                         (FabArrayBase *)
                         (local_a18 * 4.98197357e-22 +
                         dVar36 * -4.73515235e-18 +
                         dVar32 * 1.61561948e-14 + dVar31 * -2.30842973e-11 + 2.50000001);
                    local_718.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(local_a18 * 1.22833691e-15 +
                                  dVar36 * -1.00177799e-11 +
                                  dVar32 * 4.19484589e-08 + dVar31 * -8.59741137e-05 + 2.56942078);
                    local_718.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(local_a18 * -2.16717794e-14 +
                                  dVar36 * 2.09470555e-10 +
                                  dVar32 * -7.57966669e-07 + dVar31 * 0.00148308754 + 3.28253784);
                    local_718.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(local_a18 * 1.17412376e-14 +
                                  dVar36 * -8.79461556e-11 +
                                  dVar32 * 1.26505228e-07 + dVar31 * 0.000548429716 + 3.09288767);
                    dStack_700 = local_a18 * 1.68200992e-14 +
                                 dVar36 * -9.7041987e-11 +
                                 dVar32 * -1.64072518e-07 + dVar31 * 0.00217691804 + 3.03399249;
                    local_6f8 = local_a18 * -1.07908535e-14 +
                                dVar36 * 1.1424637e-10 +
                                dVar32 * -6.3365815e-07 + dVar31 * 0.00223982013 + 4.0172109;
                    pVStack_6f0 = (Vector<int,_std::allocator<int>_> *)
                                  (local_a18 * -1.87727567e-14 +
                                  dVar36 * 2.60179549e-10 +
                                  dVar32 * -1.40894597e-06 + dVar31 * 0.00365639292 + 2.87410113);
                    local_6e8 = (Vector<int,_std::allocator<int>_> *)
                                (local_a18 * -3.39716365e-14 +
                                dVar36 * 4.17906e-10 +
                                dVar32 * -2.01191947e-06 + dVar31 * 0.00465588637 + 2.29203842);
                    pVStack_6e0 = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                  (local_a18 * -4.67154394e-14 +
                                  dVar36 * 5.95684644e-10 +
                                  dVar32 * -2.98714348e-06 + dVar31 * 0.00723990037 + 2.28571772);
                    local_6d8 = (Vector<int,_std::allocator<int>_> *)
                                (local_a18 * -1.0181523e-13 +
                                dVar36 * 1.22292535e-09 +
                                dVar32 * -5.73285809e-06 + dVar31 * 0.0133909467 + 0.074851495);
                    pVStack_6d0 = (Vector<int,_std::allocator<int>_> *)
                                  (local_a18 * -2.03647716e-14 +
                                  dVar36 * 2.30053008e-10 +
                                  dVar32 * -9.98825771e-07 + dVar31 * 0.00206252743 + 2.71518561);
                    local_6c8 = local_a18 * -4.72084164e-14 +
                                dVar36 * 5.23490188e-10 +
                                dVar32 * -2.21481404e-06 + dVar31 * 0.00441437026 + 3.85746029;
                    dStack_6c0 = local_a18 * -5.33508711e-14 +
                                 dVar36 * 5.89161778e-10 +
                                 dVar32 * -2.48445613e-06 + dVar31 * 0.00495695526 + 2.77217438;
                    local_6b8 = local_a18 * -8.8385564e-14 +
                                dVar36 * 1.00641212e-09 +
                                dVar32 * -4.42258813e-06 + dVar31 * 0.00920000082 + 1.76069008;
                    dStack_6b0 = local_a18 * -2.112616e-14 +
                                 dVar36 * 3.944431e-10 +
                                 dVar32 * -2.656384e-06 + dVar31 * 0.007871497 + 3.770799;
                    local_6a8 = local_a18 * -1.25706061e-13 +
                                dVar36 * 1.47222923e-09 +
                                dVar32 * -6.71077915e-06 + dVar31 * 0.0146454151 + 2.03611116;
                    dStack_6a0 = local_a18 * -1.49641576e-13 +
                                 dVar36 * 1.75217689e-09 +
                                 dVar32 * -7.98206668e-06 + dVar31 * 0.0173972722 + 1.95465642;
                    local_698 = local_a18 * -1.9000289e-13 +
                                dVar36 * 2.21412001e-09 +
                                dVar32 * -1.00256067e-05 + dVar31 * 0.0216852677 + 1.0718815;
                    dVar37 = dVar36 * 1.0097038e-10 +
                             dVar32 * -5.68476e-07 + dVar31 * 0.0014879768 + 2.92664;
                    dVar41 = local_a18 * -6.753351e-15;
                  }
                  else {
                    local_728._0_8_ =
                         local_a18 * -7.37611761e-12 +
                         dVar36 * 2.01572094e-08 +
                         dVar32 * -1.9478151e-05 + dVar31 * 0.00798052075 + 2.34433112;
                    local_728._8_8_ =
                         (FabArrayBase *)
                         (local_a18 * -9.27732332e-22 +
                         dVar36 * 2.30081632e-18 +
                         dVar32 * -1.99591964e-15 + dVar31 * 7.05332819e-13 + 2.5);
                    local_718.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(local_a18 * 2.11265971e-12 +
                                  dVar36 * -6.12806624e-09 +
                                  dVar32 * 6.64306396e-06 + dVar31 * -0.00327931884 + 3.1682671);
                    local_718.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(local_a18 * 3.24372837e-12 +
                                  dVar36 * -9.68129509e-09 +
                                  dVar32 * 9.84730201e-06 + dVar31 * -0.00299673416 + 3.78245636);
                    local_718.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(local_a18 * 1.3641147e-12 +
                                  dVar36 * -3.88113333e-09 +
                                  dVar32 * 4.61793841e-06 + dVar31 * -0.00240131752 + 3.99201543);
                    dStack_700 = local_a18 * 1.77197817e-12 +
                                 dVar36 * -5.48797062e-09 +
                                 dVar32 * 6.52040211e-06 + dVar31 * -0.0020364341 + 4.19864056;
                    local_6f8 = local_a18 * 9.29225124e-12 +
                                dVar36 * -2.42763894e-08 +
                                dVar32 * 2.11582891e-05 + dVar31 * -0.00474912051 + 4.30179801;
                    pVStack_6f0 = (Vector<int,_std::allocator<int>_> *)
                                  (local_a18 * 1.68741719e-12 +
                                  dVar36 * -3.85091153e-09 +
                                  dVar32 * 2.79489841e-06 + dVar31 * 0.000968872143 + 3.76267867);
                    local_6e8 = (Vector<int,_std::allocator<int>_> *)
                                (local_a18 * 1.94314737e-12 +
                                dVar36 * -6.68815981e-09 +
                                dVar32 * 8.2329622e-06 + dVar31 * -0.00236661419 + 4.19860411);
                    pVStack_6e0 = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                                  (local_a18 * 2.54385734e-12 +
                                  dVar36 * -6.87117425e-09 +
                                  dVar32 * 5.73021856e-06 + dVar31 * 0.00201095175 + 3.6735904);
                    local_6d8 = (Vector<int,_std::allocator<int>_> *)
                                (local_a18 * 1.66693956e-11 +
                                dVar36 * -4.84743026e-08 +
                                dVar32 * 4.91800599e-05 + dVar31 * -0.0136709788 + 5.14987613);
                    pVStack_6d0 = (Vector<int,_std::allocator<int>_> *)
                                  (local_a18 * -9.04424499e-13 +
                                  dVar36 * 9.07005884e-10 +
                                  dVar32 * 1.01681433e-06 + dVar31 * -0.00061035368 + 3.57953347);
                    local_6c8 = local_a18 * -1.43699548e-13 +
                                dVar36 * 2.45919022e-09 +
                                dVar32 * -7.12356269e-06 + dVar31 * 0.00898459677 + 2.35677352;
                    dStack_6c0 = local_a18 * 4.33768865e-12 +
                                 dVar36 * -1.33144093e-08 +
                                 dVar32 * 1.37799446e-05 + dVar31 * -0.00324392532 + 4.22118584;
                    local_6b8 = local_a18 * 1.31772652e-11 +
                                dVar36 * -3.79285261e-08 +
                                dVar32 * 3.73220008e-05 + dVar31 * -0.00990833369 + 4.79372315;
                    dStack_6b0 = local_a18 * 2.07561e-12 +
                                 dVar36 * -7.377636e-09 +
                                 dVar32 * 5.338472e-06 + dVar31 * 0.007216595 + 2.106204;
                    local_6a8 = local_a18 * 2.69884373e-11 +
                                dVar36 * -6.91588753e-08 +
                                dVar32 * 5.70990292e-05 + dVar31 * -0.00757052247 + 3.95920148;
                    dStack_6a0 = local_a18 * 2.30509004e-11 +
                                 dVar36 * -5.99126606e-08 +
                                 dVar32 * 4.97142807e-05 + dVar31 * -0.00418658892 + 4.30646568;
                    local_698 = local_a18 * 2.68685771e-11 +
                                dVar36 * -7.08466285e-08 +
                                dVar32 * 5.99438288e-05 + dVar31 * -0.0055015427 + 4.29142492;
                    dVar37 = dVar36 * 5.641515e-09 +
                             dVar32 * -3.963222e-06 + dVar31 * 0.0014082404 + 3.298677;
                    dVar41 = local_a18 * -2.444854e-12;
                  }
                  local_690 = dVar41 + dVar37;
                  local_558 = dVar31 * 0.0;
                  uStack_550 = 0;
                  local_568 = dVar32 * 0.0;
                  uStack_560 = 0;
                  local_578 = dVar36 * 0.0;
                  uStack_570 = 0;
                  local_588 = local_a18 * 0.0;
                  uStack_580 = 0;
                  local_688 = local_558 + 2.5 + local_568 + local_578 + local_588;
                  lVar19 = 0;
                  do {
                    (&local_258[0].p)[lVar19] =
                         (double *)
                         (*(double *)(local_728 + lVar19 * 8) * *(double *)(local_ac8 + lVar19 * 8)
                         * (double)(&local_7d8.p)[lVar19]);
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 0x15);
                  dVar41 = 0.0;
                  lVar19 = 0;
                  do {
                    dVar41 = dVar41 + (double)(&local_258[0].p)[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 0x15);
                  uStack_a10 = 0;
                  if (1000.0 <= dVar31) {
                    local_868 = local_a18 * -8.8385564e-14 +
                                dVar36 * 1.00641212e-09 +
                                dVar32 * -4.42258813e-06 + dVar31 * 0.00920000082 + 0.76069008;
                    dStack_860 = local_a18 * -2.112616e-14 +
                                 dVar36 * 3.944431e-10 +
                                 dVar32 * -2.656384e-06 + dVar31 * 0.007871497 + 2.770799;
                    local_878 = local_a18 * -4.72084164e-14 +
                                dVar36 * 5.23490188e-10 +
                                dVar32 * -2.21481404e-06 + dVar31 * 0.00441437026 + 2.85746029;
                    dStack_870 = local_a18 * -5.33508711e-14 +
                                 dVar36 * 5.89161778e-10 +
                                 dVar32 * -2.48445613e-06 + dVar31 * 0.00495695526 + 1.77217438;
                    dVar43 = local_a18 * -1.0181523e-13 +
                             dVar36 * 1.22292535e-09 +
                             dVar32 * -5.73285809e-06 + dVar31 * 0.0133909467 + -0.925148505;
                    dVar44 = local_a18 * -2.03647716e-14 +
                             dVar36 * 2.30053008e-10 +
                             dVar32 * -9.98825771e-07 + dVar31 * 0.00206252743 + 1.71518561;
                    dVar45 = local_a18 * -3.39716365e-14 +
                             dVar36 * 4.17906e-10 +
                             dVar32 * -2.01191947e-06 + dVar31 * 0.00465588637 + 1.29203842;
                    dVar46 = local_a18 * -4.67154394e-14 +
                             dVar36 * 5.95684644e-10 +
                             dVar32 * -2.98714348e-06 + dVar31 * 0.00723990037 + 1.28571772;
                    dVar50 = local_a18 * 2.00255376e-14 +
                             dVar36 * -1.79566394e-10 +
                             dVar32 * 4.99456778e-07 + dVar31 * -4.94024731e-05 + 2.3372792;
                    dVar51 = local_a18 * -1.87727567e-14 +
                             dVar36 * 2.60179549e-10 +
                             dVar32 * -1.40894597e-06 + dVar31 * 0.00365639292 + 1.87410113;
                    dVar34 = local_a18 * 1.22833691e-15 +
                             dVar36 * -1.00177799e-11 +
                             dVar32 * 4.19484589e-08 + dVar31 * -8.59741137e-05 + 1.56942078;
                    dVar35 = local_a18 * 4.98197357e-22 +
                             dVar36 * -4.73515235e-18 +
                             dVar32 * 1.61561948e-14 + dVar31 * -2.30842973e-11 + 1.50000001;
                    dVar52 = local_a18 * 1.17412376e-14 +
                             dVar36 * -8.79461556e-11 +
                             dVar32 * 1.26505228e-07 + dVar31 * 0.000548429716 + 2.09288767;
                    dVar53 = local_a18 * -2.16717794e-14 +
                             dVar36 * 2.09470555e-10 +
                             dVar32 * -7.57966669e-07 + dVar31 * 0.00148308754 + 2.28253784;
                    dVar47 = local_a18 * -1.07908535e-14 +
                             dVar36 * 1.1424637e-10 +
                             dVar32 * -6.3365815e-07 + dVar31 * 0.00223982013 + 3.0172109;
                    dVar48 = local_a18 * 1.68200992e-14 +
                             dVar36 * -9.7041987e-11 +
                             dVar32 * -1.64072518e-07 + dVar31 * 0.00217691804 + 2.03399249;
                    dVar37 = local_a18 * -1.25706061e-13 +
                             dVar36 * 1.47222923e-09 +
                             dVar32 * -6.71077915e-06 + dVar31 * 0.0146454151 + 1.03611116;
                    dVar40 = local_a18 * -1.49641576e-13 +
                             dVar36 * 1.75217689e-09 +
                             dVar32 * -7.98206668e-06 + dVar31 * 0.0173972722 + 0.95465642;
                    dVar42 = local_a18 * -1.9000289e-13 +
                             dVar36 * 2.21412001e-09 +
                             dVar32 * -1.00256067e-05 + dVar31 * 0.0216852677 + 0.0718815;
                    dVar31 = dVar36 * 1.0097038e-10 +
                             dVar32 * -5.68476e-07 + dVar31 * 0.0014879768 + 1.92664;
                    dVar36 = local_a18 * -6.753351e-15;
                  }
                  else {
                    local_868 = local_a18 * 1.31772652e-11 +
                                dVar36 * -3.79285261e-08 +
                                dVar32 * 3.73220008e-05 + dVar31 * -0.00990833369 + 3.79372315;
                    dStack_860 = local_a18 * 2.07561e-12 +
                                 dVar36 * -7.377636e-09 +
                                 dVar32 * 5.338472e-06 + dVar31 * 0.007216595 + 1.106204;
                    local_878 = local_a18 * -1.43699548e-13 +
                                dVar36 * 2.45919022e-09 +
                                dVar32 * -7.12356269e-06 + dVar31 * 0.00898459677 + 1.35677352;
                    dStack_870 = local_a18 * 4.33768865e-12 +
                                 dVar36 * -1.33144093e-08 +
                                 dVar32 * 1.37799446e-05 + dVar31 * -0.00324392532 + 3.22118584;
                    dVar43 = local_a18 * 1.66693956e-11 +
                             dVar36 * -4.84743026e-08 +
                             dVar32 * 4.91800599e-05 + dVar31 * -0.0136709788 + 4.14987613;
                    dVar44 = local_a18 * -9.04424499e-13 +
                             dVar36 * 9.07005884e-10 +
                             dVar32 * 1.01681433e-06 + dVar31 * -0.00061035368 + 2.57953347;
                    dVar45 = local_a18 * 1.94314737e-12 +
                             dVar36 * -6.68815981e-09 +
                             dVar32 * 8.2329622e-06 + dVar31 * -0.00236661419 + 3.19860411;
                    dVar46 = local_a18 * 2.54385734e-12 +
                             dVar36 * -6.87117425e-09 +
                             dVar32 * 5.73021856e-06 + dVar31 * 0.00201095175 + 2.6735904;
                    dVar50 = local_a18 * -7.37611761e-12 +
                             dVar36 * 2.01572094e-08 +
                             dVar32 * -1.9478151e-05 + dVar31 * 0.00798052075 + 1.34433112;
                    dVar51 = local_a18 * 1.68741719e-12 +
                             dVar36 * -3.85091153e-09 +
                             dVar32 * 2.79489841e-06 + dVar31 * 0.000968872143 + 2.76267867;
                    dVar34 = local_a18 * 2.11265971e-12 +
                             dVar36 * -6.12806624e-09 +
                             dVar32 * 6.64306396e-06 + dVar31 * -0.00327931884 + 2.1682671;
                    dVar35 = local_a18 * -9.27732332e-22 +
                             dVar36 * 2.30081632e-18 +
                             dVar32 * -1.99591964e-15 + dVar31 * 7.05332819e-13 + 1.5;
                    dVar52 = local_a18 * 1.3641147e-12 +
                             dVar36 * -3.88113333e-09 +
                             dVar32 * 4.61793841e-06 + dVar31 * -0.00240131752 + 2.99201543;
                    dVar53 = local_a18 * 3.24372837e-12 +
                             dVar36 * -9.68129509e-09 +
                             dVar32 * 9.84730201e-06 + dVar31 * -0.00299673416 + 2.78245636;
                    dVar47 = local_a18 * 9.29225124e-12 +
                             dVar36 * -2.42763894e-08 +
                             dVar32 * 2.11582891e-05 + dVar31 * -0.00474912051 + 3.30179801;
                    dVar48 = local_a18 * 1.77197817e-12 +
                             dVar36 * -5.48797062e-09 +
                             dVar32 * 6.52040211e-06 + dVar31 * -0.0020364341 + 3.19864056;
                    dVar37 = local_a18 * 2.69884373e-11 +
                             dVar36 * -6.91588753e-08 +
                             dVar32 * 5.70990292e-05 + dVar31 * -0.00757052247 + 2.95920148;
                    dVar40 = local_a18 * 2.30509004e-11 +
                             dVar36 * -5.99126606e-08 +
                             dVar32 * 4.97142807e-05 + dVar31 * -0.00418658892 + 3.30646568;
                    dVar42 = local_a18 * 2.68685771e-11 +
                             dVar36 * -7.08466285e-08 +
                             dVar32 * 5.99438288e-05 + dVar31 * -0.0055015427 + 3.29142492;
                    dVar31 = dVar36 * 5.641515e-09 +
                             dVar32 * -3.963222e-06 + dVar31 * 0.0014082404 + 2.298677;
                    dVar36 = local_a18 * -2.444854e-12;
                  }
                  auVar38._0_8_ =
                       (local_408 * (dVar49 * 0.0 + dVar4 * 0.0 + dVar30 * 0.0 + dVar33 * 0.0 + 1.5)
                        * 0.025031289111389236 +
                       local_418 * local_858 * 0.03569643749553795 +
                       local_428 * local_838 * 0.03325573661456601 +
                       local_438 * local_808 * 0.034409194136673316 +
                       local_448 * local_7e8 * 0.035645540742853074 +
                       dStack_ae0 * local_458 * 0.032222723464587225 +
                       local_ae8 * local_468 * 0.033304469459801506 +
                       dStack_9f0 * local_488 * 0.03446136880556896 +
                       local_478 * local_9f8 * 0.022722624917630486 +
                       local_498 * dStack_a00 * 0.035701535166012134 +
                       local_4a8 * local_a08 * 0.06233248145608677 +
                       local_4b8 * dStack_b20 * 0.06651147322913202 +
                       local_4c8 * local_b28 * 0.07129108148570615 +
                       local_4d8 * dStack_7f0 * 0.07129108148570615 +
                       local_4e8 * local_7f8 * 0.030297521662727988 +
                       local_4f8 * dStack_820 * 0.055509297807382736 +
                       local_508 * local_828 * 0.05879931792791203 +
                       local_518 * dStack_840 * 0.03125195324707794 +
                       local_528 * local_848 * 0.06250390649415588 +
                       local_538 * dStack_810 * 0.9920634920634921 +
                       local_548 * local_818 * 0.49603174603174605 + 0.0) * 83144626.1815324;
                  auVar38._8_8_ =
                       (dStack_a28 * (local_588 + local_578 + local_568 + local_558 + 1.5) *
                        0.025031289111389236 +
                       local_a30 * (dVar36 + dVar31) * 0.03569643749553795 +
                       dStack_a38 * dVar42 * 0.03325573661456601 +
                       local_a40 * dVar40 * 0.034409194136673316 +
                       dStack_a48 * dVar37 * 0.035645540742853074 +
                       dStack_860 * local_a50 * 0.032222723464587225 +
                       local_868 * dStack_a58 * 0.033304469459801506 +
                       dStack_870 * local_a60 * 0.03446136880556896 +
                       local_a68 * local_878 * 0.022722624917630486 +
                       dStack_a70 * dVar44 * 0.035701535166012134 +
                       local_a78 * dVar43 * 0.06233248145608677 +
                       dStack_a80 * dVar46 * 0.06651147322913202 +
                       local_a88 * dVar45 * 0.07129108148570615 +
                       dStack_a90 * dVar51 * 0.07129108148570615 +
                       local_a98 * dVar47 * 0.030297521662727988 +
                       dStack_aa0 * dVar48 * 0.055509297807382736 +
                       local_aa8 * dVar52 * 0.05879931792791203 +
                       (double)local_ac8._24_8_ * dVar53 * 0.03125195324707794 +
                       (double)CONCAT44(local_ac8._20_4_,local_ac8._16_4_) * dVar34 *
                       0.06250390649415588 +
                       (double)CONCAT44(local_ac8._12_4_,local_ac8._8_4_) * dVar35 *
                       0.9920634920634921 +
                       (double)CONCAT44(local_ac8._4_4_,local_ac8._0_4_) * dVar50 *
                       0.49603174603174605 + 0.0) * 83144626.1815324;
                  auVar39._8_4_ = SUB84(dVar41 * 83144626.1815324,0);
                  auVar39._0_8_ = local_9e8 * 83144626.1815324;
                  auVar39._12_4_ = (int)((ulong)(dVar41 * 83144626.1815324) >> 0x20);
                  auVar39 = divpd(auVar38,auVar39);
                  auVar8._8_8_ = RStack_590;
                  auVar8._0_8_ = local_598;
                  auVar39 = divpd(auVar39,auVar8);
                  local_8c0[iVar18 - local_8d8] = (auVar39._8_8_ + auVar39._0_8_) * 0.5;
                  bVar29 = iVar18 != iVar12;
                  iVar18 = iVar18 + 1;
                } while (bVar29);
              }
              bVar29 = iVar10 != iVar13;
              iVar10 = iVar10 + 1;
            } while (bVar29);
          }
          bVar29 = iVar9 != iVar14;
          iVar9 = iVar9 + 1;
        } while (bVar29);
      }
      amrex::MFIter::operator++(&local_2b8);
    } while (local_2b8.currentIndex < local_2b8.endIndex);
  }
  amrex::MFIter::~MFIter(&local_2b8);
  this_01 = local_9d8;
  RVar5 = getMFsum(local_9d8,mac_divu,0);
  RVar6 = getMFsum(this_01,(MultiFab *)&local_1b0,0);
  dVar33 = RVar5 / lev0cellCount;
  thetabar = RVar6 / lev0cellCount;
  amrex::MultiFab::plus(mac_divu,-dVar33,0,1,0);
  amrex::MultiFab::plus((MultiFab *)&local_1b0,-thetabar,0,1,0);
  dp0dt = dVar33 / thetabar;
  p_amb_new = (dVar3 - dVar2) * dp0dt + p_amb_old;
  amrex::MFIter::MFIter((MFIter *)local_728,(FabArrayBase *)mac_divu,true);
  if ((int)local_718.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < dStack_700._0_4_) {
    do {
      amrex::MFIter::tilebox((Box *)local_ac8,(MFIter *)local_728);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (local_258,&mac_divu->super_FabArray<amrex::FArrayBox>,(MFIter *)local_728);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_7d8,&local_1b0,(MFIter *)local_728);
      if ((int)local_ac8._8_4_ <= (int)local_ac8._20_4_) {
        dVar3 = dVar33 / thetabar;
        lVar19 = (long)(int)local_ac8._4_4_;
        local_a08 = (double)((lVar19 - local_258[0].begin.y) * local_258[0].jstride * 8 +
                             (long)(int)local_ac8._0_4_ * 8 + (long)local_258[0].begin.x * -8 +
                            (long)local_258[0].p);
        local_9f8 = (double)(local_258[0].kstride * 8);
        local_9e8 = (double)(local_7d8.kstride * 8);
        iVar21 = local_ac8._8_4_;
        do {
          if ((int)local_ac8._4_4_ <= (int)local_ac8._16_4_) {
            lVar25 = ((long)iVar21 - (long)local_258[0].begin.z) * (long)local_9f8 + (long)local_a08
            ;
            lVar24 = (long)local_7d8.p +
                     ((long)iVar21 - (long)local_7d8.begin.z) * (long)local_9e8 +
                     (lVar19 - local_7d8.begin.y) * local_7d8.jstride * 8 +
                     (long)(int)local_ac8._0_4_ * 8 + (long)local_7d8.begin.x * -8;
            lVar22 = lVar19;
            do {
              if ((int)local_ac8._0_4_ <= (int)local_ac8._12_4_) {
                lVar27 = 0;
                do {
                  *(double *)(lVar25 + lVar27 * 8) =
                       *(double *)(lVar25 + lVar27 * 8) - *(double *)(lVar24 + lVar27 * 8) * dVar3;
                  lVar27 = lVar27 + 1;
                } while ((local_ac8._12_4_ - local_ac8._0_4_) + 1 != (int)lVar27);
              }
              lVar22 = lVar22 + 1;
              lVar25 = lVar25 + local_258[0].jstride * 8;
              lVar24 = lVar24 + local_7d8.jstride * 8;
            } while (local_ac8._16_4_ + 1 != (int)lVar22);
          }
          bVar29 = iVar21 != local_ac8._20_4_;
          iVar21 = iVar21 + 1;
        } while (bVar29);
      }
      amrex::MFIter::operator++((MFIter *)local_728);
    } while ((int)local_718.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < dStack_700._0_4_);
  }
  amrex::MFIter::~MFIter((MFIter *)local_728);
  if (NavierStokesBase::verbose != 0) {
    local_728._8_8_ = amrex::OutStream();
    local_728._4_4_ = *(undefined4 *)(DAT_00842950 + -0x48);
    local_728._0_4_ = *(undefined4 *)(DAT_00842950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_718);
    *(undefined8 *)
     ((long)&local_718.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish +
     local_718.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length) =
         *(undefined8 *)
          ((*(_func_int ***)local_728._8_8_)[-3] + (long)&((BoxArray *)(local_728._8_8_ + 8))->m_bat
          );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_718,"level 0: prev_time, p_amb_old, p_amb_new, delta = ",0x32);
    std::ostream::_M_insert<double>(dVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_718," ",1);
    std::ostream::_M_insert<double>(p_amb_old);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_718," ",1);
    std::ostream::_M_insert<double>(p_amb_new);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_718," ",1);
    std::ostream::_M_insert<double>(p_amb_new - p_amb_old);
    cVar7 = (char)(ostringstream *)&local_718;
    std::ios::widen((char)local_718.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1]._M_string_length + cVar7);
    std::ostream::put(cVar7);
    std::ostream::flush();
    amrex::Print::~Print((Print *)local_728);
  }
  amrex::MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return dVar33;
}

Assistant:

Real
PeleLM::adjust_p_and_divu_for_closed_chamber(MultiFab& mac_divu)
{
   const MultiFab& S_new = get_new_data(State_Type);
   const MultiFab& S_old = get_old_data(State_Type);

   const Real prev_time = state[State_Type].prevTime();
   const Real cur_time  = state[State_Type].curTime();
   const Real dt = cur_time - prev_time;

   // used for closed chamber algorithm
   MultiFab theta_halft(grids,dmap,1,nGrowAdvForcing);

   // compute old, new, and time-centered theta = 1 / (gamma P)
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S_old,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& rhoY_o  = S_old.const_array(mfi,first_spec);
      auto const& rhoY_n  = S_new.const_array(mfi,first_spec);
      auto const& T_o     = S_old.const_array(mfi,Temp);
      auto const& T_n     = S_new.const_array(mfi,Temp);
      auto const& theta   = theta_halft.array(mfi);
      amrex::Real pamb_o  = p_amb_old;
      amrex::Real pamb_n  = p_amb_new;

      amrex::ParallelFor(bx, [rhoY_o, rhoY_n, T_o, T_n, theta, pamb_o, pamb_n]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         amrex::Real gammaInv_o = getGammaInv( i, j, k, rhoY_o, T_o );
         amrex::Real gammaInv_n = getGammaInv( i, j, k, rhoY_n, T_n );
         theta(i,j,k) = 0.5 * ( gammaInv_o/pamb_o + gammaInv_n/pamb_n );
      });
   }

   // Get S sum and theta sum
   Real Ssum = getMFsum(mac_divu,0);
   Real thetasum = getMFsum(theta_halft,0);

   // Normalize by cell count / uncovered cell count if EB
   Real Sbar = Ssum/lev0cellCount;
   thetabar  = thetasum/lev0cellCount;

   // subtract mean from mac_divu and theta_nph
   mac_divu.plus(-Sbar,0,1);
   theta_halft.plus(-thetabar,0,1);

   p_amb_new = p_amb_old + dt*(Sbar/thetabar);
   dp0dt = Sbar/thetabar;

   // update mac rhs by adding delta_theta * (Sbar / thetabar)
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(mac_divu,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& m_divu  = mac_divu.array(mfi);
      auto const& theta   = theta_halft.const_array(mfi);
      amrex::Real scaling = Sbar/thetabar;

      amrex::ParallelFor(bx, [m_divu, theta, scaling]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         m_divu(i,j,k) -= theta(i,j,k) * scaling;
      });
   }

   if (verbose) {
      amrex::Print() << "level 0: prev_time, p_amb_old, p_amb_new, delta = "
                     << prev_time << " " << p_amb_old << " " << p_amb_new << " "
                     << p_amb_new-p_amb_old << std::endl;
   }

   return Sbar;
}